

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall
CLI::ConfigBase::to_config
          (string *__return_storage_ptr__,ConfigBase *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  pointer puVar1;
  Option *this_00;
  size_t __n;
  pointer pcVar2;
  pointer psVar3;
  App *pAVar4;
  App *pAVar5;
  size_type sVar6;
  byte bVar7;
  int iVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  ostream *poVar10;
  pointer pbVar11;
  long lVar12;
  pointer psVar13;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  _Var14;
  size_t sVar15;
  App *pAVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  undefined8 *puVar18;
  long *plVar19;
  undefined7 in_register_00000009;
  char *pcVar20;
  long *plVar21;
  size_type *psVar22;
  ulong *puVar23;
  App **ppAVar24;
  pointer pbVar25;
  undefined8 uVar26;
  _Alloc_hider _Var27;
  undefined7 in_register_00000081;
  pointer ppAVar28;
  byte bVar29;
  pointer ppAVar30;
  Option_p *opt;
  pointer puVar31;
  string *psVar32;
  ConfigBase *pCVar33;
  bool bVar34;
  string single_name;
  string name;
  string value;
  string commentLead;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  string keyChars;
  string commentTest;
  results_t results;
  stringstream out;
  value_type local_468;
  string local_448;
  ConfigBase *local_428;
  uint local_41c;
  string local_418;
  uint local_3f4;
  uint local_3f0;
  uint local_3ec;
  string local_3e8;
  string local_3c8;
  App *local_3a0;
  string *local_398;
  string local_388;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_350;
  string *local_338;
  App **local_330;
  string local_328;
  undefined1 *local_308;
  long local_300;
  undefined1 local_2f8 [16];
  long *local_2e8;
  long local_2e0;
  long local_2d8;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  _Any_data local_298;
  code *local_288;
  undefined8 uStack_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_278 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  string local_258;
  string local_238 [2];
  string local_1f8;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_41c = (uint)CONCAT71(in_register_00000081,write_description);
  local_3ec = (uint)CONCAT71(in_register_00000009,default_also);
  local_398 = prefix;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  local_3e8._M_string_length = 0;
  local_3e8.field_2._M_local_buf[0] = '\0';
  local_428 = this;
  ::std::__cxx11::string::push_back((char)&local_3e8);
  ::std::__cxx11::string::push_back((char)&local_3e8);
  local_308 = local_2f8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"#;","");
  ::std::__cxx11::string::push_back((char)&local_308);
  ::std::__cxx11::string::push_back((char)&local_308);
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_328,local_308,local_308 + local_300);
  local_338 = __return_storage_ptr__;
  ::std::__cxx11::string::push_back((char)&local_328);
  ::std::__cxx11::string::push_back((char)&local_328);
  ::std::__cxx11::string::push_back((char)&local_328);
  ::std::__cxx11::string::push_back((char)&local_328);
  ::std::__cxx11::string::push_back((char)&local_328);
  ::std::__cxx11::string::push_back((char)&local_328);
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_368.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar31 = (app->options_).
            super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (app->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar31 != puVar1) {
    do {
      _Var9 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (local_368.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_368.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (puVar31->_M_t).
                         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      if (_Var9._M_current ==
          local_368.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_368,
                    (value_type *)
                    (puVar31->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      }
      puVar31 = puVar31 + 1;
    } while (puVar31 != puVar1);
  }
  pbVar25 = local_368.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"options","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval(&local_368,(const_iterator)pbVar25,&local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  local_2c0 = local_368.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0 = app;
  if (local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_368.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar7 = 0;
    pbVar25 = local_368.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar8 = ::std::__cxx11::string::compare((char *)pbVar25);
      pCVar33 = local_428;
      if (((iVar8 != 0) && (bVar29 = bVar7, pbVar25->_M_string_length != 0)) ||
         (bVar29 = 1, (bVar7 & 1) == 0)) {
        if ((((char)local_41c != '\0') &&
            (iVar8 = ::std::__cxx11::string::compare((char *)pbVar25), iVar8 != 0)) &&
           (pbVar25->_M_string_length != 0)) {
          local_468._M_dataplus._M_p._0_1_ = 10;
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,(char *)&local_468,1);
          local_468._M_dataplus._M_p._0_1_ = pCVar33->commentChar;
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(char *)&local_468,1);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(pbVar25->_M_dataplus)._M_p,pbVar25->_M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," Options\n",9);
        }
        local_298._M_unused._M_object = (void *)0x0;
        local_298._8_8_ = 0;
        local_288 = (code *)0x0;
        uStack_280 = 0;
        App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                         &local_388,app,(function<bool_(const_CLI::Option_*)> *)&local_298);
        local_3f4 = CONCAT31(local_3f4._1_3_,bVar29);
        if (local_288 != (code *)0x0) {
          (*local_288)(&local_298,&local_298,__destroy_functor);
        }
        local_330 = (App **)local_388._M_string_length;
        _Var27._M_p = local_388._M_dataplus._M_p;
        if (local_388._M_dataplus._M_p != (pointer)local_388._M_string_length) {
          do {
            this_00 = *(Option **)_Var27._M_p;
            if (((this_00->super_OptionBase<CLI::Option>).configurable_ == true) &&
               (((__n = (this_00->super_OptionBase<CLI::Option>).group_._M_string_length,
                 __n == pbVar25->_M_string_length &&
                 ((__n == 0 ||
                  (iVar8 = bcmp((this_00->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p,
                                (pbVar25->_M_dataplus)._M_p,__n), iVar8 == 0)))) ||
                ((iVar8 = ::std::__cxx11::string::compare((char *)pbVar25), iVar8 == 0 &&
                 ((this_00->super_OptionBase<CLI::Option>).group_._M_string_length == 0)))))) {
              pbVar11 = (this_00->lnames_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((pbVar11 ==
                   (this_00->lnames_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) &&
                 (pbVar11 = (this_00->snames_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 pbVar11 ==
                 (this_00->snames_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
                pbVar11 = (pointer)&(&this_00->pname_)[(this_00->pname_)._M_string_length == 0].
                                    _M_dataplus;
              }
              pcVar2 = (pbVar11->_M_dataplus)._M_p;
              local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_468,pcVar2,pcVar2 + pbVar11->_M_string_length);
              if (local_468._M_string_length == 0) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_468._M_dataplus._M_p != &local_468.field_2) goto LAB_0010e8c6;
              }
              else {
                Option::reduced_results_abi_cxx11_((results_t *)&local_2b8,this_00);
                detail::ini_join(&local_418,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_2b8,pCVar33->arraySeparator,pCVar33->arrayStart,
                                 pCVar33->arrayEnd,pCVar33->stringQuote,pCVar33->literalQuote);
                bVar7 = (char *)local_418._M_string_length == (char *)0x0 & (byte)local_3ec;
                local_3f0 = CONCAT31(local_3f0._1_3_,bVar7);
                if (bVar7 == 1) {
                  pcVar2 = (this_00->default_str_)._M_dataplus._M_p;
                  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_448,pcVar2,
                             pcVar2 + (this_00->default_str_)._M_string_length);
                  sVar6 = local_448._M_string_length;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_448._M_dataplus._M_p != &local_448.field_2) {
                    operator_delete(local_448._M_dataplus._M_p);
                  }
                  if (sVar6 == 0) {
                    if (this_00->expected_min_ == 0) {
                      pcVar20 = "false";
                    }
                    else {
                      pcVar20 = "\"\"";
                      if ((this_00->run_callback_for_default_ == false) &&
                         (pcVar20 = "\"\"",
                         (this_00->super_OptionBase<CLI::Option>).required_ != false)) {
                        pcVar20 = "\"<REQUIRED>\"";
                      }
                    }
                    ::std::__cxx11::string::_M_replace
                              ((ulong)&local_418,0,(char *)local_418._M_string_length,(ulong)pcVar20
                              );
                  }
                  else {
                    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
                    pcVar2 = (this_00->default_str_)._M_dataplus._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_3c8,pcVar2,
                               pcVar2 + (this_00->default_str_)._M_string_length);
                    detail::convert_arg_for_ini
                              (&local_448,&local_3c8,local_428->stringQuote,local_428->literalQuote,
                               false);
                    ::std::__cxx11::string::operator=((string *)&local_418,(string *)&local_448);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_448._M_dataplus._M_p != &local_448.field_2) {
                      operator_delete(local_448._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                      operator_delete(local_3c8._M_dataplus._M_p);
                    }
                  }
                }
                if ((char *)local_418._M_string_length != (char *)0x0) {
                  if ((this_00->fnames_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      (this_00->fnames_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)local_238,local_418._M_dataplus._M_p,
                               (char *)(local_418._M_string_length +
                                       (long)local_418._M_dataplus._M_p));
                    Option::get_flag_value(&local_448,this_00,&local_468,local_238);
                    ::std::__cxx11::string::operator=((string *)&local_418,(string *)&local_448);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_448._M_dataplus._M_p != &local_448.field_2) {
                      operator_delete(local_448._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
                      operator_delete(local_238[0]._M_dataplus._M_p);
                    }
                  }
                  if (((char)local_41c != '\0') && ((this_00->description_)._M_string_length != 0))
                  {
                    lVar12 = ::std::ostream::tellp();
                    if (lVar12 != 0) {
                      local_448._M_dataplus._M_p._0_1_ = 10;
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,(char *)&local_448,1);
                    }
                    poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (local_1a8,local_3e8._M_dataplus._M_p,
                                         local_3e8._M_string_length);
                    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                    pcVar2 = (this_00->description_)._M_dataplus._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_258,pcVar2,
                               pcVar2 + (this_00->description_)._M_string_length);
                    detail::fix_newlines(&local_448,&local_3e8,&local_258);
                    poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar10,local_448._M_dataplus._M_p,
                                         local_448._M_string_length);
                    local_3c8._M_dataplus._M_p._0_1_ = 10;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(char *)&local_3c8,1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_448._M_dataplus._M_p != &local_448.field_2) {
                      operator_delete(local_448._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_258._M_dataplus._M_p != &local_258.field_2) {
                      operator_delete(local_258._M_dataplus._M_p);
                    }
                  }
                  clean_name_string(&local_468,&local_328);
                  ::std::operator+(&local_448,local_398,&local_468);
                  pCVar33 = local_428;
                  if (((byte)local_3f0 & local_428->commentDefaultsBool) == 1) {
                    ::std::operator+(&local_3c8,local_428->commentChar,&local_448);
                    ::std::__cxx11::string::operator=((string *)&local_448,(string *)&local_3c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                      operator_delete(local_3c8._M_dataplus._M_p);
                    }
                  }
                  poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (local_1a8,local_448._M_dataplus._M_p,
                                       local_448._M_string_length);
                  local_3c8._M_dataplus._M_p._0_1_ = pCVar33->valueDelimiter;
                  poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar10,(char *)&local_3c8,1);
                  poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar10,local_418._M_dataplus._M_p,local_418._M_string_length
                                      );
                  local_3c8._M_dataplus._M_p._0_1_ = 10;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_3c8,1)
                  ;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_448._M_dataplus._M_p != &local_448.field_2) {
                    operator_delete(local_448._M_dataplus._M_p);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_418._M_dataplus._M_p != &local_418.field_2) {
                  operator_delete(local_418._M_dataplus._M_p);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_2b8);
                pCVar33 = local_428;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_468._M_dataplus._M_p != &local_468.field_2) {
LAB_0010e8c6:
                  operator_delete(local_468._M_dataplus._M_p);
                }
              }
            }
            _Var27._M_p = _Var27._M_p + 8;
          } while ((App **)_Var27._M_p != local_330);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_388._M_dataplus._M_p);
        }
        app = local_3a0;
        bVar7 = (byte)local_3f4;
      }
      pbVar25 = pbVar25 + 1;
    } while (pbVar25 != local_2c0);
  }
  local_468.field_2._M_allocated_capacity = 0;
  local_468.field_2._8_8_ = 0;
  local_468._M_dataplus._M_p = (pointer)0x0;
  local_468._M_string_length = 0;
  std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::vector
            (&local_350,
             (long)(app->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(app->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_418);
  psVar3 = (app->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppAVar24 = local_350.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  for (psVar13 = (app->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar13 != psVar3; psVar13 = psVar13 + 1
      ) {
    *ppAVar24 = (psVar13->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ppAVar24 = ppAVar24 + 1;
  }
  if (((code *)local_468.field_2._M_allocated_capacity != (code *)0x0) &&
     (_Var14 = ::std::
               __remove_if<__gnu_cxx::__normal_iterator<CLI::App_const**,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::get_subcommands(std::function<bool(CLI::App_const*)>const&)const::_lambda(CLI::App_const*)_1_>>
                         ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                           )local_350.
                            super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                          (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                           )local_350.
                            super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish,
                          (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_app_CLI11_hpp:8806:39)>
                           )&local_468),
     _Var14._M_current !=
     local_350.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    local_350.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)_Var14;
  }
  if ((code *)local_468.field_2._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_468.field_2._M_allocated_capacity)(&local_468,&local_468,3);
  }
  ppAVar30 = local_350.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_3f0 = local_3ec & 0xff;
  local_3f4 = local_41c & 0xff;
  if (local_350.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_350.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppAVar28 = local_350.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar4 = *ppAVar28;
      if (((pAVar4->name_)._M_string_length == 0) &&
         (((byte)local_3ec != '\0' || (sVar15 = App::count_all(pAVar4), sVar15 != 0)))) {
        if (((char)local_41c != '\0') && ((pAVar4->group_)._M_string_length != 0)) {
          local_468._M_dataplus._M_p._0_1_ = 10;
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,(char *)&local_468,1);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_3e8._M_dataplus._M_p,local_3e8._M_string_length);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(pAVar4->group_)._M_dataplus._M_p,
                               (pAVar4->group_)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," Options\n",9);
        }
        pcVar2 = (local_398->_M_dataplus)._M_p;
        local_1d8[0] = local_1c8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,pcVar2,pcVar2 + local_398->_M_string_length);
        (**(local_428->super_Config)._vptr_Config)
                  (&local_468,local_428,pAVar4,(ulong)local_3f0,(ulong)local_3f4,(string *)local_1d8
                  );
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_468._M_dataplus._M_p,local_468._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p);
        }
        if (local_1d8[0] != local_1c8) {
          operator_delete(local_1d8[0]);
        }
      }
      ppAVar28 = ppAVar28 + 1;
    } while (ppAVar28 != ppAVar30);
  }
  local_330 = local_350.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_350.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_350.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppAVar30 = local_350.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar4 = *ppAVar30;
      if (((pAVar4->name_)._M_string_length != 0) &&
         (((byte)local_3ec != '\0' || (sVar15 = App::count_all(pAVar4), sVar15 != 0)))) {
        pcVar2 = (pAVar4->name_)._M_dataplus._M_p;
        local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_468,pcVar2,pcVar2 + (pAVar4->name_)._M_string_length);
        clean_name_string(&local_468,&local_328);
        if ((pAVar4->configurable_ == true) &&
           (((byte)local_3ec != '\0' ||
            (pAVar16 = App::get_subcommand(local_3a0,pAVar4), pAVar16->parsed_ != 0)))) {
          if ((local_398->_M_string_length == 0) && (local_3a0->parent_ != (App *)0x0)) {
            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            pcVar2 = (local_3a0->name_)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_418,pcVar2,pcVar2 + (local_3a0->name_)._M_string_length);
            clean_name_string(&local_418,&local_328);
            local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_3c8,local_418._M_dataplus._M_p,
                       (char *)(local_418._M_string_length + (long)local_418._M_dataplus._M_p));
            ::std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_3c8,local_3c8._M_string_length,0,'\x01');
            plVar19 = (long *)::std::__cxx11::string::_M_append
                                        ((char *)&local_3c8,(ulong)local_468._M_dataplus._M_p);
            psVar22 = (size_type *)(plVar19 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar19 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar22) {
              local_448.field_2._M_allocated_capacity = *psVar22;
              local_448.field_2._8_8_ = plVar19[3];
              local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
            }
            else {
              local_448.field_2._M_allocated_capacity = *psVar22;
              local_448._M_dataplus._M_p = (pointer)*plVar19;
            }
            local_448._M_string_length = plVar19[1];
            *plVar19 = (long)psVar22;
            plVar19[1] = 0;
            *(undefined1 *)(plVar19 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)&local_468,(string *)&local_448);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_448._M_dataplus._M_p != &local_448.field_2) {
              operator_delete(local_448._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
              operator_delete(local_3c8._M_dataplus._M_p);
            }
            pAVar16 = local_3a0->parent_;
            pAVar5 = pAVar16->parent_;
            while (pAVar5 != (App *)0x0) {
              local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
              pcVar2 = (pAVar16->name_)._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_448,pcVar2,pcVar2 + (pAVar16->name_)._M_string_length);
              clean_name_string(&local_448,&local_328);
              local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_388,local_448._M_dataplus._M_p,
                         local_448._M_dataplus._M_p + local_448._M_string_length);
              ::std::__cxx11::string::_M_replace_aux
                        ((ulong)&local_388,local_388._M_string_length,0,'\x01');
              plVar19 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_388,(ulong)local_468._M_dataplus._M_p);
              puVar23 = (ulong *)(plVar19 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar19 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_3c8.field_2._M_allocated_capacity = *puVar23;
                local_3c8.field_2._8_8_ = plVar19[3];
                local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
              }
              else {
                local_3c8.field_2._M_allocated_capacity = *puVar23;
                local_3c8._M_dataplus._M_p = (pointer)*plVar19;
              }
              local_3c8._M_string_length = plVar19[1];
              *plVar19 = (long)puVar23;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)&local_468,(string *)&local_3c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                operator_delete(local_3c8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_388._M_dataplus._M_p != &local_388.field_2) {
                operator_delete(local_388._M_dataplus._M_p);
              }
              pAVar16 = pAVar16->parent_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_448._M_dataplus._M_p != &local_448.field_2) {
                operator_delete(local_448._M_dataplus._M_p);
              }
              pAVar5 = pAVar16->parent_;
            }
            local_448._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_448._M_dataplus._M_p >> 8);
            local_448._M_dataplus._M_p._0_1_ = 0x5b;
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,(char *)&local_448,1);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_468._M_dataplus._M_p,local_468._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]\n",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != &local_418.field_2) {
              operator_delete(local_418._M_dataplus._M_p);
            }
          }
          else {
            local_418._M_dataplus._M_p._0_1_ = 0x5b;
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,(char *)&local_418,1);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(local_398->_M_dataplus)._M_p,local_398->_M_string_length);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_468._M_dataplus._M_p,local_468._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]\n",2);
          }
          local_278[0] = &local_268;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"");
          (**(local_428->super_Config)._vptr_Config)
                    (&local_418,local_428,pAVar4,(ulong)local_3f0,(ulong)local_3f4,
                     (string *)local_278);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_418._M_dataplus._M_p,local_418._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p);
          }
          paVar17 = &local_268;
          _Var27._M_p = (pointer)local_278[0];
        }
        else {
          ::std::operator+(&local_448,local_398,&local_468);
          plVar19 = (long *)::std::__cxx11::string::_M_replace_aux
                                      ((ulong)&local_448,local_448._M_string_length,0,'\x01');
          local_2e8 = &local_2d8;
          plVar21 = plVar19 + 2;
          if ((long *)*plVar19 == plVar21) {
            local_2d8 = *plVar21;
            uStack_2d0 = (undefined4)plVar19[3];
            uStack_2cc = *(undefined4 *)((long)plVar19 + 0x1c);
          }
          else {
            local_2d8 = *plVar21;
            local_2e8 = (long *)*plVar19;
          }
          local_2e0 = plVar19[1];
          *plVar19 = (long)plVar21;
          plVar19[1] = 0;
          *(undefined1 *)(plVar19 + 2) = 0;
          (**(local_428->super_Config)._vptr_Config)
                    (&local_418,local_428,pAVar4,(ulong)local_3f0,(ulong)local_3f4,&local_2e8);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_418._M_dataplus._M_p,local_418._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p);
          }
          if (local_2e8 != &local_2d8) {
            operator_delete(local_2e8);
          }
          paVar17 = &local_448.field_2;
          _Var27._M_p = local_448._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var27._M_p != paVar17) {
          operator_delete(_Var27._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p);
        }
      }
      ppAVar30 = ppAVar30 + 1;
    } while (ppAVar30 != local_330);
  }
  if ((char)local_41c == '\0') {
    bVar34 = false;
  }
  else {
    ::std::__cxx11::stringbuf::str();
    bVar34 = local_468._M_string_length != 0;
  }
  psVar32 = local_338;
  if (((char)local_41c != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2)) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  pCVar33 = local_428;
  if (!bVar34) {
    ::std::__cxx11::stringbuf::str();
    goto LAB_0010f623;
  }
  ::std::operator+(&local_3c8,local_428->commentChar,&local_3e8);
  ::std::operator+(&local_2b8,pCVar33->commentChar,&local_3e8);
  pcVar2 = (local_3a0->description_)._M_dataplus._M_p;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar2,pcVar2 + (local_3a0->description_)._M_string_length);
  detail::fix_newlines(&local_388,&local_2b8,&local_1f8);
  uVar26 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    uVar26 = local_3c8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar26 < local_388._M_string_length + local_3c8._M_string_length) {
    uVar26 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      uVar26 = local_388.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar26 < local_388._M_string_length + local_3c8._M_string_length) goto LAB_0010f43b;
    puVar18 = (undefined8 *)
              ::std::__cxx11::string::replace
                        ((ulong)&local_388,0,(char *)0x0,(ulong)local_3c8._M_dataplus._M_p);
  }
  else {
LAB_0010f43b:
    puVar18 = (undefined8 *)
              ::std::__cxx11::string::_M_append
                        ((char *)&local_3c8,(ulong)local_388._M_dataplus._M_p);
  }
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  psVar22 = puVar18 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar18 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar22) {
    local_448.field_2._M_allocated_capacity = *psVar22;
    local_448.field_2._8_8_ = puVar18[3];
  }
  else {
    local_448.field_2._M_allocated_capacity = *psVar22;
    local_448._M_dataplus._M_p = (pointer)*puVar18;
  }
  local_448._M_string_length = puVar18[1];
  *puVar18 = psVar22;
  puVar18[1] = 0;
  *(undefined1 *)psVar22 = 0;
  plVar19 = (long *)::std::__cxx11::string::_M_replace_aux
                              ((ulong)&local_448,local_448._M_string_length,0,'\x01');
  psVar22 = (size_type *)(plVar19 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar19 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar22) {
    local_418.field_2._M_allocated_capacity = *psVar22;
    local_418.field_2._8_8_ = plVar19[3];
    local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  }
  else {
    local_418.field_2._M_allocated_capacity = *psVar22;
    local_418._M_dataplus._M_p = (pointer)*plVar19;
  }
  local_418._M_string_length = plVar19[1];
  *plVar19 = (long)psVar22;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  ::std::__cxx11::stringbuf::str();
  psVar32 = local_338;
  plVar19 = (long *)::std::__cxx11::string::replace
                              ((ulong)&local_448,0,(char *)0x0,(ulong)local_418._M_dataplus._M_p);
  (psVar32->_M_dataplus)._M_p = (pointer)&psVar32->field_2;
  psVar22 = (size_type *)(plVar19 + 2);
  if ((size_type *)*plVar19 == psVar22) {
    lVar12 = plVar19[3];
    (psVar32->field_2)._M_allocated_capacity = *psVar22;
    *(long *)((long)&psVar32->field_2 + 8) = lVar12;
  }
  else {
    (psVar32->_M_dataplus)._M_p = (pointer)*plVar19;
    (psVar32->field_2)._M_allocated_capacity = *psVar22;
  }
  psVar32->_M_string_length = plVar19[1];
  *plVar19 = (long)psVar22;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p);
  }
LAB_0010f623:
  if (local_350.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (App **)0x0) {
    operator_delete(local_350.
                    super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar32;
}

Assistant:

CLI11_INLINE std::string
ConfigBase::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    std::string commentLead;
    commentLead.push_back(commentChar);
    commentLead.push_back(' ');

    std::string commentTest = "#;";
    commentTest.push_back(commentChar);
    commentTest.push_back(parentSeparatorChar);

    std::string keyChars = commentTest;
    keyChars.push_back(literalQuote);
    keyChars.push_back(stringQuote);
    keyChars.push_back(arrayStart);
    keyChars.push_back(arrayEnd);
    keyChars.push_back(valueDelimiter);
    keyChars.push_back(arraySeparator);

    std::vector<std::string> groups = app->get_groups();
    bool defaultUsed = false;
    groups.insert(groups.begin(), std::string("options"));

    for(auto &group : groups) {
        if(group == "options" || group.empty()) {
            if(defaultUsed) {
                continue;
            }
            defaultUsed = true;
        }
        if(write_description && group != "options" && !group.empty()) {
            out << '\n' << commentChar << commentLead << group << " Options\n";
        }
        for(const Option *opt : app->get_options({})) {
            // Only process options that are configurable
            if(opt->get_configurable()) {
                if(opt->get_group() != group) {
                    if(!(group == "options" && opt->get_group().empty())) {
                        continue;
                    }
                }
                std::string single_name = opt->get_single_name();
                if(single_name.empty()) {
                    continue;
                }

                auto results = opt->reduced_results();
                std::string value =
                    detail::ini_join(results, arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);

                bool isDefault = false;
                if(value.empty() && default_also) {
                    if(!opt->get_default_str().empty()) {
                        value = detail::convert_arg_for_ini(opt->get_default_str(), stringQuote, literalQuote, false);
                    } else if(opt->get_expected_min() == 0) {
                        value = "false";
                    } else if(opt->get_run_callback_for_default() || !opt->get_required()) {
                        value = "\"\"";  // empty string default value
                    } else {
                        value = "\"<REQUIRED>\"";
                    }
                    isDefault = true;
                }

                if(!value.empty()) {
                    if(!opt->get_fnames().empty()) {
                        try {
                            value = opt->get_flag_value(single_name, value);
                        } catch(const CLI::ArgumentMismatch &) {
                            bool valid{false};
                            for(const auto &test_name : opt->get_fnames()) {
                                try {
                                    value = opt->get_flag_value(test_name, value);
                                    single_name = test_name;
                                    valid = true;
                                } catch(const CLI::ArgumentMismatch &) {
                                    continue;
                                }
                            }
                            if(!valid) {
                                value = detail::ini_join(
                                    opt->results(), arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);
                            }
                        }
                    }
                    if(write_description && opt->has_description()) {
                        if(out.tellp() != std::streampos(0)) {
                            out << '\n';
                        }
                        out << commentLead << detail::fix_newlines(commentLead, opt->get_description()) << '\n';
                    }
                    clean_name_string(single_name, keyChars);

                    std::string name = prefix + single_name;
                    if(commentDefaultsBool && isDefault) {
                        name = commentChar + name;
                    }
                    out << name << valueDelimiter << value << '\n';
                }
            }
        }
    }

    auto subcommands = app->get_subcommands({});
    for(const App *subcom : subcommands) {
        if(subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            if(write_description && !subcom->get_group().empty()) {
                out << '\n' << commentLead << subcom->get_group() << " Options\n";
            }
            /*if (!prefix.empty() || app->get_parent() == nullptr) {
                out << '[' << prefix << "___"<< subcom->get_group() << "]\n";
            } else {
                std::string subname = app->get_name() + parentSeparatorChar + "___"+subcom->get_group();
                const auto *p = app->get_parent();
                while(p->get_parent() != nullptr) {
                    subname = p->get_name() + parentSeparatorChar +subname;
                    p = p->get_parent();
                }
                out << '[' << subname << "]\n";
            }
            */
            out << to_config(subcom, default_also, write_description, prefix);
        }
    }

    for(const App *subcom : subcommands) {
        if(!subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            std::string subname = subcom->get_name();
            clean_name_string(subname, keyChars);

            if(subcom->get_configurable() && (default_also || app->got_subcommand(subcom))) {
                if(!prefix.empty() || app->get_parent() == nullptr) {

                    out << '[' << prefix << subname << "]\n";
                } else {
                    std::string appname = app->get_name();
                    clean_name_string(appname, keyChars);
                    subname = appname + parentSeparatorChar + subname;
                    const auto *p = app->get_parent();
                    while(p->get_parent() != nullptr) {
                        std::string pname = p->get_name();
                        clean_name_string(pname, keyChars);
                        subname = pname + parentSeparatorChar + subname;
                        p = p->get_parent();
                    }
                    out << '[' << subname << "]\n";
                }
                out << to_config(subcom, default_also, write_description, "");
            } else {
                out << to_config(subcom, default_also, write_description, prefix + subname + parentSeparatorChar);
            }
        }
    }

    if(write_description && !out.str().empty()) {
        std::string outString =
            commentChar + commentLead + detail::fix_newlines(commentChar + commentLead, app->get_description()) + '\n';
        return outString + out.str();
    }
    return out.str();
}